

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_rbtree.c
# Opt level: O0

void ngx_rbtree_insert(ngx_rbtree_t *tree,ngx_rbtree_node_t *node)

{
  ngx_rbtree_node_t *sentinel_00;
  ngx_rbtree_node_t *pnVar1;
  bool bVar2;
  ngx_rbtree_node_t *sentinel;
  ngx_rbtree_node_t *temp;
  ngx_rbtree_node_t **root;
  ngx_rbtree_node_t *node_local;
  ngx_rbtree_t *tree_local;
  
  sentinel_00 = tree->sentinel;
  if (tree->root == sentinel_00) {
    node->parent = (ngx_rbtree_node_t *)0x0;
    node->left = sentinel_00;
    node->right = sentinel_00;
    node->color = '\0';
    tree->root = node;
  }
  else {
    (*tree->insert)(tree->root,node,sentinel_00);
    root = (ngx_rbtree_node_t **)node;
    while( true ) {
      bVar2 = false;
      if ((ngx_rbtree_node_t *)root != tree->root) {
        bVar2 = root[3]->color != '\0';
      }
      if (!bVar2) break;
      if (root[3] == root[3]->parent->left) {
        pnVar1 = root[3]->parent->right;
        if (pnVar1->color == '\0') {
          if ((ngx_rbtree_node_t *)root == root[3]->right) {
            root = (ngx_rbtree_node_t **)root[3];
            ngx_rbtree_left_rotate(&tree->root,sentinel_00,(ngx_rbtree_node_t *)root);
          }
          root[3]->color = '\0';
          root[3]->parent->color = '\x01';
          ngx_rbtree_right_rotate(&tree->root,sentinel_00,root[3]->parent);
        }
        else {
          root[3]->color = '\0';
          pnVar1->color = '\0';
          root[3]->parent->color = '\x01';
          root = (ngx_rbtree_node_t **)root[3]->parent;
        }
      }
      else {
        pnVar1 = root[3]->parent->left;
        if (pnVar1->color == '\0') {
          if ((ngx_rbtree_node_t *)root == root[3]->left) {
            root = (ngx_rbtree_node_t **)root[3];
            ngx_rbtree_right_rotate(&tree->root,sentinel_00,(ngx_rbtree_node_t *)root);
          }
          root[3]->color = '\0';
          root[3]->parent->color = '\x01';
          ngx_rbtree_left_rotate(&tree->root,sentinel_00,root[3]->parent);
        }
        else {
          root[3]->color = '\0';
          pnVar1->color = '\0';
          root[3]->parent->color = '\x01';
          root = (ngx_rbtree_node_t **)root[3]->parent;
        }
      }
    }
    tree->root->color = '\0';
  }
  return;
}

Assistant:

void
ngx_rbtree_insert(ngx_rbtree_t *tree, ngx_rbtree_node_t *node)
{
    ngx_rbtree_node_t  **root, *temp, *sentinel;

    /* a binary tree insert */

    root = &tree->root;
    sentinel = tree->sentinel;

    if (*root == sentinel) {
        node->parent = NULL;
        node->left = sentinel;
        node->right = sentinel;
        ngx_rbt_black(node);
        *root = node;

        return;
    }

    tree->insert(*root, node, sentinel);

    /* re-balance tree */

    while (node != *root && ngx_rbt_is_red(node->parent)) {

        if (node->parent == node->parent->parent->left) {
            temp = node->parent->parent->right;

            if (ngx_rbt_is_red(temp)) {
                ngx_rbt_black(node->parent);
                ngx_rbt_black(temp);
                ngx_rbt_red(node->parent->parent);
                node = node->parent->parent;

            } else {
                if (node == node->parent->right) {
                    node = node->parent;
                    ngx_rbtree_left_rotate(root, sentinel, node);
                }

                ngx_rbt_black(node->parent);
                ngx_rbt_red(node->parent->parent);
                ngx_rbtree_right_rotate(root, sentinel, node->parent->parent);
            }

        } else {
            temp = node->parent->parent->left;

            if (ngx_rbt_is_red(temp)) {
                ngx_rbt_black(node->parent);
                ngx_rbt_black(temp);
                ngx_rbt_red(node->parent->parent);
                node = node->parent->parent;

            } else {
                if (node == node->parent->left) {
                    node = node->parent;
                    ngx_rbtree_right_rotate(root, sentinel, node);
                }

                ngx_rbt_black(node->parent);
                ngx_rbt_red(node->parent->parent);
                ngx_rbtree_left_rotate(root, sentinel, node->parent->parent);
            }
        }
    }

    ngx_rbt_black(*root);
}